

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obme.cpp
# Opt level: O2

char * obme::OBME_D(char *data,int length)

{
  char cVar1;
  ulong uVar2;
  
  for (uVar2 = (ulong)(uint)length; 1 < (int)uVar2; uVar2 = uVar2 - 1) {
    cVar1 = OBME<char>(data[uVar2 - 1]);
    data[uVar2 - 1] = cVar1;
  }
  return data;
}

Assistant:

char* OBME_D(char *data, int length)
	{
		while(length > 1) {
			--length;
			data[length] = OBME(data[length]);
		}
		return data;
	}